

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1ToType2Converter.cpp
# Opt level: O1

EStatusCode __thiscall
Type1ToType2Converter::Type1Vstem(Type1ToType2Converter *this,LongList *inOperandList)

{
  _List_node_base *p_Var1;
  EStatusCode EVar2;
  Trace *this_00;
  
  if ((inOperandList->super__List_base<long,_std::allocator<long>_>)._M_impl._M_node._M_size < 2) {
    this_00 = Trace::DefaultTrace();
    Trace::TraceToLog(this_00,
                      "Type1ToType2Converter::Type1Vstem, vestem expecting 2 arguments, got %d. aborting."
                      ,(inOperandList->super__List_base<long,_std::allocator<long>_>)._M_impl.
                       _M_node._M_size);
    EVar2 = eFailure;
  }
  else {
    p_Var1 = (inOperandList->super__List_base<long,_std::allocator<long>_>)._M_impl._M_node.
             super__List_node_base._M_prev;
    AddVStem(this,(long)p_Var1->_M_prev[1]._M_next,(long)p_Var1[1]._M_next);
    if (this->mFirstPathConstructionEncountered == true) {
      this->mHintAdditionEncountered = true;
    }
    RecordOperatorWithParameters(this,3,inOperandList);
    EVar2 = eSuccess;
  }
  return EVar2;
}

Assistant:

EStatusCode Type1ToType2Converter::Type1Vstem(const LongList& inOperandList)
{
	if(inOperandList.size() < 2) {
		TRACE_LOG1("Type1ToType2Converter::Type1Vstem, vestem expecting 2 arguments, got %d. aborting.", inOperandList.size());
		return eFailure;
	}
		
	LongList::const_reverse_iterator it = inOperandList.rbegin();

	long extent = *it;
	++it;
	long origin = *it;
	AddVStem(origin,extent);
	if(mFirstPathConstructionEncountered)
		mHintAdditionEncountered = true;
	return RecordOperatorWithParameters(3,inOperandList);
}